

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
Imf_3_4::CompositeDeepScanLine::addSource(CompositeDeepScanLine *this,DeepScanLineInputFile *file)

{
  Data *this_00;
  Header *header;
  DeepScanLineInputFile *local_20;
  
  this_00 = this->_Data;
  local_20 = file;
  header = DeepScanLineInputFile::header(file);
  Data::check_valid(this_00,header);
  std::vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>::
  push_back(&this->_Data->_file,&local_20);
  return;
}

Assistant:

void
CompositeDeepScanLine::addSource (DeepScanLineInputFile* file)
{
    _Data->check_valid (file->header ());
    _Data->_file.push_back (file);
}